

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool binomial_check(int a,double b)

{
  char *pcVar1;
  
  if (a < 1) {
    pcVar1 = "  A < 1.\n";
  }
  else {
    pcVar1 = "  B < 0 or 1 < B.\n";
    if ((0.0 <= b) && (b <= 1.0)) {
      return true;
    }
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BINOMIAL_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return false;
}

Assistant:

bool binomial_check ( int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BINOMIAL_CHECK checks the parameter of the Binomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//    1 <= A.
//
//    Input, double B, the probability of success on one trial.
//    0.0 <= B <= 1.0.
//
//    Output, bool BINOMIAL_CHECK, is true if the parameters are legal.
//
{
  if ( a < 1 )
  {
    cerr << "\n";
    cerr << "BINOMIAL_CHECK - Warning!\n";
    cerr << "  A < 1.\n";
    return false;
  }

  if ( b < 0.0 || 1.0 < b )
  {
    cerr << "\n";
    cerr << "BINOMIAL_CHECK - Warning!\n";
    cerr << "  B < 0 or 1 < B.\n";
    return false;
  }

  return true;
}